

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O2

void amrex::FillSignedDistance
               (MultiFab *mf,Level *ls_lev,EBFArrayBoxFactory *eb_factory,int refratio,
               bool fluid_has_positive_sign)

{
  int *piVar1;
  int i;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  Real RVar7;
  undefined1 auVar8 [16];
  int iVar9;
  undefined4 uVar10;
  Real RVar11;
  Real RVar12;
  Real RVar13;
  double *pdVar14;
  Long LVar15;
  pointer pGVar16;
  pointer piVar17;
  pointer piVar18;
  bool bVar19;
  int ifac;
  undefined4 extraout_EAX;
  uint uVar20;
  MultiCutFab *this;
  FabArray<amrex::EBCellFlagFab> *this_00;
  Box *this_01;
  Long LVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  double *pdVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  size_type a_size;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  int j;
  int iVar40;
  long lVar41;
  int iVar42;
  double dVar43;
  ulong uVar44;
  double dVar47;
  double dVar48;
  double dVar49;
  undefined1 auVar50 [16];
  double dVar45;
  double dVar46;
  int iVar52;
  undefined1 auVar51 [16];
  ulong extraout_XMM0_Qb;
  double dVar53;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  double dVar57;
  int iVar60;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar64;
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  double dVar65;
  double dVar66;
  double dVar67;
  ulong in_XMM5_Qb;
  undefined1 auVar68 [16];
  double dVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined8 uVar73;
  undefined1 auVar74 [16];
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  Periodicity PVar83;
  double local_748;
  double local_728;
  ulong uStack_6d0;
  ulong uStack_6b0;
  double local_698;
  Box eb_search;
  Box local_5b4;
  undefined1 local_598 [16];
  undefined8 local_588;
  double *pdStack_580;
  double local_578;
  double dStack_570;
  undefined8 local_568;
  double *pdStack_560;
  double local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  ulong uStack_540;
  double local_538;
  double dStack_530;
  Real local_528;
  undefined8 local_520;
  int local_518;
  undefined8 local_510;
  int local_508;
  IntVect ind_facets;
  undefined4 uStack_4e0;
  double local_4d8;
  double local_458;
  double local_448 [4];
  RealVect c_vec_tmp;
  RealVect facet_p0;
  RealVect facet_normal;
  Array4<double> local_3a8;
  Array<const_MultiCutFab_*,_3> local_368;
  undefined8 local_350;
  double local_348;
  double local_340;
  double local_338;
  double dStack_330;
  undefined1 local_328 [16];
  Real local_318;
  Real RStack_310;
  double local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [16];
  RealVect edge_v;
  RealVect edge_p0;
  Array4<const_double> local_2b0;
  DeviceVector<GpuArray<Real,_3_*_2>_> facets;
  DeviceVector<int> cutcell_offset;
  DeviceVector<int> is_cut;
  Periodicity local_228;
  undefined4 uStack_21c;
  double local_218;
  double local_210;
  Real RStack_208;
  Real local_200;
  int local_1f8;
  pointer local_1f0;
  double local_1e8;
  double local_1e0;
  ulong local_198;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter mfi;
  
  bVar19 = FabArrayBase::is_nodal((FabArrayBase *)mf);
  if (!bVar19) {
    Assert_host("mf.is_nodal()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB_utils.cpp"
                ,0x1d6,(char *)0x0);
  }
  EB2::Level::fillLevelSet(ls_lev,mf,&ls_lev->m_geom);
  this = EBFArrayBoxFactory::getBndryCent(eb_factory);
  EBFArrayBoxFactory::getAreaFrac(&local_368,eb_factory);
  this_00 = EBFArrayBoxFactory::getMultiEBCellFlagFab(eb_factory);
  dVar6 = (ls_lev->m_geom).super_CoordSys.dx[0];
  RVar7 = (ls_lev->m_geom).super_CoordSys.dx[1];
  local_538 = (eb_factory->m_geom).super_CoordSys.dx[0];
  dVar5 = (eb_factory->m_geom).super_CoordSys.dx[1];
  local_558 = (eb_factory->m_geom).super_CoordSys.dx[2];
  dVar65 = dVar5;
  if (dVar5 <= local_538) {
    dVar65 = local_538;
  }
  dVar4 = local_558;
  if (local_558 <= dVar65) {
    dVar4 = dVar65;
  }
  dVar65 = dVar5;
  if (local_538 <= dVar5) {
    dVar65 = local_538;
  }
  uStack_550 = 0;
  dVar43 = local_558;
  if (dVar65 <= local_558) {
    dVar43 = dVar65;
  }
  dVar43 = (double)((this_00->super_FabArrayBase).n_grow.vect[0] + 1) * dVar43;
  uVar44 = 0x3ff0000000000000;
  if (!fluid_has_positive_sign) {
    uVar44 = 0xbff0000000000000;
  }
  uStack_6d0 = 0;
  i = (this->m_data).super_FabArrayBase.n_grow.vect[0];
  local_528 = (ls_lev->m_geom).super_CoordSys.dx[2];
  dStack_530 = dVar5;
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,'\0');
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar44;
  local_598 = _DAT_006f1af0 ^ auVar62;
  auVar8._8_8_ = dStack_530;
  auVar8._0_8_ = local_538;
  auVar62 = divpd(_DAT_006f56c0,auVar8);
  dVar65 = 1.0 / local_558;
  local_308 = dVar4 + dVar43;
  uStack_300 = 0;
  auVar63._8_8_ = auVar62._8_8_;
  auVar63._0_8_ = auVar63._8_8_;
  local_328._8_8_ = local_558;
  local_328._0_8_ = local_558;
  local_338 = local_538;
  dStack_330 = local_538;
  local_318 = RVar7;
  RStack_310 = RVar7;
  local_2f8 = auVar63;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      PVar83 = Geometry::periodicity(&ls_lev->m_geom);
      local_228.period.vect._0_8_ = PVar83.period.vect._0_8_;
      local_228.period.vect[2] = PVar83.period.vect[2];
      FabArray<amrex::FArrayBox>::FillBoundary<double>
                (&mf->super_FabArray<amrex::FArrayBox>,0,1,&local_228,false);
      return;
    }
    MFIter::fabbox(&local_5b4,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_3a8,&mf->super_FabArray<amrex::FArrayBox>,&mfi);
    bVar19 = MultiCutFab::ok(this,&mfi);
    auVar77 = _DAT_006f8e90;
    auVar8 = _DAT_006f8e80;
    if (bVar19) {
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>(&local_d0,this_00,&mfi);
      MFIter::validbox(&eb_search,&mfi);
      this_01 = Box::coarsen(&eb_search,refratio);
      for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
        if (((this_01->btype).itype >> ((uint)lVar26 & 0x1f) & 1) != 0) {
          piVar1 = (this_01->bigend).vect + lVar26;
          *piVar1 = *piVar1 + -1;
        }
      }
      (this_01->btype).itype = 0;
      Box::grow(this_01,i);
      LVar21 = Box::numPts(&eb_search);
      uVar20 = (uint)LVar21;
      PODVector<int,_std::allocator<int>_>::PODVector(&is_cut,(long)(int)uVar20);
      piVar18 = is_cut.m_data;
      PODVector<int,_std::allocator<int>_>::PODVector(&cutcell_offset,(long)(int)uVar20);
      piVar17 = cutcell_offset.m_data;
      if (0 < (int)uVar20) {
        lVar26 = ((long)eb_search.bigend.vect[0] - (long)eb_search.smallend.vect[0]) + 1;
        lVar41 = (long)(((eb_search.bigend.vect[1] - eb_search.smallend.vect[1]) + 1) * (int)lVar26)
        ;
        a_size = 0;
        for (uVar27 = 0; iVar60 = (int)a_size, (uVar20 & 0x7fffffff) != uVar27; uVar27 = uVar27 + 1)
        {
          lVar31 = (long)uVar27 % lVar41;
          uVar30 = (uint)((local_d0.p
                           [((int)(lVar31 / lVar26) +
                            (eb_search.smallend.vect[1] - local_d0.begin.y)) * local_d0.jstride +
                            (long)((int)(lVar31 % lVar26) +
                                  (eb_search.smallend.vect[0] - local_d0.begin.x)) +
                            ((int)((long)uVar27 / lVar41) +
                            (eb_search.smallend.vect[2] - local_d0.begin.z)) * local_d0.kstride].
                           flag & 3) == 1);
          piVar18[uVar27] = uVar30;
          cutcell_offset.m_data[uVar27] = iVar60;
          a_size = (size_type)(uVar30 + iVar60);
        }
        if (iVar60 != 0) {
          PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>::
          PODVector(&facets,a_size);
          pGVar16 = facets.m_data;
          MultiCutFab::const_array(&local_2b0,this,&mfi);
          MultiCutFab::const_array(&local_110,local_368._M_elems[0],&mfi);
          MultiCutFab::const_array(&local_150,local_368._M_elems[1],&mfi);
          MultiCutFab::const_array(&local_190,local_368._M_elems[2],&mfi);
          LVar15 = local_3a8.kstride;
          LVar21 = local_3a8.jstride;
          pdVar14 = local_3a8.p;
          iVar9 = local_5b4.bigend.vect[0];
          iVar64 = local_5b4.smallend.vect[0];
          local_568 = (double)local_2b0.nstride;
          local_548 = (double)(long)local_190.begin.x;
          lVar26 = (long)eb_search.smallend.vect[2];
          while (lVar26 <= eb_search.bigend.vect[2]) {
            iVar52 = (int)lVar26;
            lVar41 = lVar26 + 1;
            local_588 = local_2b0.p + (lVar26 - local_2b0.begin.z) * local_2b0.kstride;
            lVar31 = (lVar26 - local_110.begin.z) * local_110.kstride;
            lVar22 = (lVar26 - local_150.begin.z) * local_150.kstride;
            lVar38 = lVar26 - local_190.begin.z;
            dVar61 = (double)(ulong)(uint)eb_search.smallend.vect[1];
            while (iVar37 = SUB84(dVar61,0), lVar26 = lVar41, iVar37 <= eb_search.bigend.vect[1]) {
              if (eb_search.bigend.vect[0] < eb_search.smallend.vect[0]) {
                dVar61 = (double)(ulong)(iVar37 + 1);
              }
              else {
                lVar26 = (long)iVar37;
                lVar33 = (lVar26 - local_2b0.begin.y) * local_2b0.jstride;
                lVar34 = (lVar26 - local_110.begin.y) * local_110.jstride;
                dVar61 = (double)(ulong)(iVar37 + 1U);
                lVar23 = (lVar26 - local_190.begin.y) * local_190.jstride;
                lVar26 = (long)eb_search.smallend.vect[0];
                do {
                  iVar42 = (int)lVar26;
                  iVar35 = (iVar42 - eb_search.smallend.vect[0]) +
                           (((iVar52 - eb_search.smallend.vect[2]) *
                             ((eb_search.bigend.vect[1] - eb_search.smallend.vect[1]) + 1) -
                            eb_search.smallend.vect[1]) + iVar37) *
                           ((eb_search.bigend.vect[0] - eb_search.smallend.vect[0]) + 1);
                  if (piVar18[iVar35] != 0) {
                    iVar35 = piVar17[iVar35];
                    lVar36 = lVar26 - local_2b0.begin.x;
                    pGVar16[iVar35].arr[0] =
                         ((double)iVar42 + local_588[lVar33 + lVar36] + 0.5) * local_538;
                    pGVar16[iVar35].arr[1] =
                         (local_588[lVar33 + lVar36 + local_2b0.nstride] + (double)iVar37 + 0.5) *
                         dVar5;
                    pGVar16[iVar35].arr[2] =
                         (local_588[lVar33 + lVar36 + local_2b0.nstride * 2] + (double)iVar52 + 0.5)
                         * local_558;
                    dVar54 = local_190.p
                             [lVar23 + (lVar26 - (long)local_548) + lVar38 * local_190.kstride];
                    dVar53 = local_190.p
                             [lVar23 + (lVar26 - (long)local_548) +
                                       ((int)lVar41 - local_190.begin.z) * local_190.kstride];
                    dVar75 = local_110.p[lVar31 + lVar34 + (lVar26 - local_110.begin.x)] -
                             local_110.p[lVar31 + lVar34 + ((iVar42 + 1) - local_110.begin.x)];
                    dVar66 = local_150.p
                             [lVar22 + (iVar37 - local_150.begin.y) * local_150.jstride +
                                       (lVar26 - local_150.begin.x)] -
                             local_150.p
                             [lVar22 + (int)((iVar37 + 1U) - local_150.begin.y) * local_150.jstride
                                       + (lVar26 - local_150.begin.x)];
                    dVar67 = dVar54 - dVar53;
                    in_XMM5_Qb = 0;
                    dVar66 = 1.0 / SQRT(dVar67 * dVar67 + dVar75 * dVar75 + dVar66 * dVar66);
                    auVar77._0_8_ =
                         dVar66 * -(local_110.p
                                    [lVar31 + lVar34 + ((iVar42 + 1) - local_110.begin.x)] -
                                   local_110.p[lVar31 + lVar34 + (lVar26 - local_110.begin.x)]);
                    auVar77._8_8_ =
                         dVar66 * -(local_150.p
                                    [lVar22 + (int)((iVar37 + 1U) - local_150.begin.y) *
                                              local_150.jstride + (lVar26 - local_150.begin.x)] -
                                   local_150.p
                                   [lVar22 + (iVar37 - local_150.begin.y) * local_150.jstride +
                                             (lVar26 - local_150.begin.x)]);
                    *(undefined1 (*) [16])(pGVar16[iVar35].arr + 3) = auVar77;
                    pGVar16[iVar35].arr[5] = -(dVar53 - dVar54) * dVar66;
                  }
                  lVar26 = lVar26 + 1;
                  local_578 = dVar61;
                } while (iVar42 + 1 != eb_search.bigend.vect[0] + 1);
              }
            }
          }
          local_228.period.vect._0_8_ = local_538;
          local_228.period.vect[2] = SUB84(dStack_530,0);
          uStack_21c = (undefined4)((ulong)dStack_530 >> 0x20);
          local_218 = local_558;
          local_200 = local_528;
          local_1f0 = pGVar16;
          auVar58._4_4_ = local_3a8.begin.y;
          auVar58._0_4_ = local_3a8.begin.x;
          auVar58._8_4_ = local_3a8.begin.z;
          auVar58._12_4_ = local_3a8.end.x;
          lVar26 = (long)local_5b4.smallend.vect[1];
          lVar31 = (long)local_5b4.bigend.vect[1];
          lVar22 = (long)local_5b4.bigend.vect[2];
          lVar38 = (long)local_3a8.begin.x;
          lVar23 = (long)local_3a8.begin.y;
          lVar33 = (long)local_3a8.begin.z;
          local_210 = dVar6;
          RStack_208 = RVar7;
          local_1f8 = iVar60;
          local_1e8 = dVar43;
          local_1e0 = dVar4;
          local_198 = uVar44;
          for (lVar41 = (long)local_5b4.smallend.vect[2]; lVar41 <= lVar22; lVar41 = lVar41 + 1) {
            auVar59._8_8_ = auVar58._8_8_;
            auVar59._0_8_ = (double)(int)lVar41 * local_528;
            lVar36 = (lVar41 - lVar33) * LVar15;
            auVar58 = auVar59;
            for (lVar34 = lVar26; lVar34 <= lVar31; lVar34 = lVar34 + 1) {
              if (iVar64 <= iVar9) {
                dVar61 = (double)(int)lVar34 * local_318;
                lVar24 = (lVar34 - lVar23) * LVar21;
                iVar60 = iVar64;
                do {
                  local_548 = (double)iVar60 * dVar6;
                  dVar54 = 1.79769313486232e+308;
                  uVar27 = 0;
                  pdVar28 = pGVar16->arr + 2;
                  for (uVar25 = 0; dVar53 = auVar58._0_8_, a_size != uVar25; uVar25 = uVar25 + 1) {
                    dVar66 = local_548 - ((GpuArray<double,_6U> *)(pdVar28 + -2))->arr[0];
                    dVar53 = (dVar53 - *pdVar28) * (dVar53 - *pdVar28) +
                             dVar66 * dVar66 + (dVar61 - pdVar28[-1]) * (dVar61 - pdVar28[-1]);
                    if (dVar53 < dVar54) {
                      uVar27 = uVar25 & 0xffffffff;
                      dVar54 = dVar53;
                    }
                    pdVar28 = pdVar28 + 6;
                  }
                  iVar52 = (int)uVar27;
                  local_578 = pGVar16[iVar52].arr[2];
                  dStack_570 = 0.0;
                  local_568 = pGVar16[iVar52].arr[3];
                  local_588 = (double *)(pGVar16[iVar52].arr + 3)[1];
                  dVar66 = pGVar16[iVar52].arr[5];
                  dVar72 = -local_568;
                  dVar76 = SUB168(*(undefined1 (*) [16])pGVar16[iVar52].arr,0);
                  dVar78 = SUB168(*(undefined1 (*) [16])pGVar16[iVar52].arr,8);
                  dVar67 = (dVar53 - local_578) * -dVar66 +
                           ((local_548 - dVar76) * dVar72 - (dVar61 - dVar78) * (double)local_588);
                  auVar2._8_4_ = auVar58._8_4_;
                  auVar2._0_8_ = dVar67;
                  auVar2._12_4_ = auVar58._12_4_;
                  dVar53 = dVar66 * dVar67 + dVar53;
                  local_458 = auVar62._0_8_;
                  pdStack_580 = local_588;
                  pdStack_560 = local_588;
                  uStack_540 = in_XMM5_Qb;
                  dVar75 = floor(local_458 * dVar76);
                  dVar45 = floor(auVar63._8_8_ * dVar78);
                  iVar42 = (int)dVar75;
                  iVar35 = (int)dVar45;
                  dVar75 = floor(dVar65 * local_578);
                  iVar37 = (int)dVar75;
                  dVar55 = dVar67 * local_568 + local_548;
                  dVar57 = dVar67 * (double)pdStack_560 + dVar61;
                  dVar75 = floor(local_458 * dVar55);
                  dVar45 = floor(auVar63._8_8_ * dVar57);
                  dVar46 = floor(dVar65 * dVar53);
                  uStack_6b0 = auVar2._8_8_;
                  auVar51._0_4_ = -(uint)(iVar42 == (int)dVar75);
                  iVar52 = -(uint)(iVar35 == (int)dVar45);
                  auVar51._4_4_ = auVar51._0_4_;
                  auVar51._8_4_ = iVar52;
                  auVar51._12_4_ = iVar52;
                  iVar52 = movmskpd(extraout_EAX,auVar51);
                  dVar67 = ABS(dVar67);
                  in_XMM5_Qb = uStack_6b0 & 0x7fffffffffffffff;
                  if ((iVar37 != (int)dVar46 || iVar52 != 3) && (dVar67 <= local_308)) {
                    uVar10 = local_568._4_4_;
                    local_4d8 = -(double)CONCAT44(local_588._4_4_,pdStack_560._0_4_);
                    for (iVar52 = -1; iVar52 != 2; iVar52 = iVar52 + 1) {
                      dVar47 = floor(((double)iVar52 * 1e-06 * local_558 + dVar53) * dVar65);
                      for (iVar39 = -1; iVar39 != 2; iVar39 = iVar39 + 1) {
                        dVar48 = floor(((double)iVar39 * 1e-06 * dVar5 + dVar57) *
                                       (double)local_2f8._0_8_);
                        iVar40 = -1;
                        while (iVar40 != 2) {
                          dVar49 = floor(((double)iVar40 * 1e-06 * local_538 + dVar55) * local_458);
                          iVar40 = iVar40 + 1;
                          if (((iVar42 == (int)dVar49) && (iVar35 == (int)dVar48)) &&
                             (iVar37 == (int)dVar47)) {
                            goto LAB_0059e481;
                          }
                        }
                      }
                    }
                    local_510 = CONCAT44((int)dVar45,(int)dVar75);
                    local_508 = (int)dVar46;
                    local_520 = CONCAT44(iVar35,iVar42);
                    local_518 = iVar37;
                    ind_facets.vect[0] = 0;
                    ind_facets.vect[1] = 0;
                    local_350._0_4_ = (undefined4)local_548;
                    local_350._4_4_ = local_548._4_4_;
                    ind_facets.vect[2] = 0;
                    local_348 = dVar61;
                    local_340 = auVar59._0_8_;
                    uVar20 = 0;
                    for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
                      if (*(int *)((long)&local_510 + lVar29 * 4) !=
                          *(int *)((long)&local_520 + lVar29 * 4)) {
                        lVar32 = (long)(int)uVar20;
                        uVar20 = uVar20 + 1;
                        ind_facets.vect[lVar32] = (int)lVar29;
                      }
                    }
                    dVar53 = local_578 * dVar66 + dVar76 * local_568 + dVar78 * (double)local_588;
                    local_578 = -(double)(iVar42 + 1) * local_338;
                    dStack_570 = -(double)iVar42 * dStack_330;
                    auVar68._4_4_ = iVar37;
                    auVar68._0_4_ = iVar37 + 1;
                    auVar68._8_8_ = 0;
                    uVar27 = (ulong)uVar20;
                    if ((int)uVar20 < 1) {
                      uVar27 = 0;
                    }
                    local_588 = (double *)(-(double)(iVar37 + 1) * (double)local_328._0_8_);
                    pdStack_580 = (double *)(-(double)iVar37 * (double)local_328._8_8_);
                    local_728 = 0.0;
                    local_748 = 0.0;
                    local_698 = 0.0;
                    dVar67 = 1.79769313486232e+308;
                    for (uVar25 = 0; in_XMM5_Qb = auVar68._8_8_, uVar25 != uVar27;
                        uVar25 = uVar25 + 1) {
                      facet_normal.vect[2] = 0.0;
                      lVar29 = (long)ind_facets.vect[uVar25];
                      facet_normal.vect[0] = 0.0;
                      facet_normal.vect[1] = 0.0;
                      facet_normal.vect[lVar29] = 1.0;
                      RVar13 = facet_normal.vect[2];
                      RVar12 = facet_normal.vect[1];
                      RVar11 = facet_normal.vect[0];
                      if ((ABS(local_568) != ABS(facet_normal.vect[0])) ||
                         (NAN(ABS(local_568)) || NAN(ABS(facet_normal.vect[0])))) {
LAB_0059e77e:
                        iVar52 = *(int *)((long)&local_520 + lVar29 * 4);
                        facet_p0.vect[0] = ((double)iVar42 + 0.5) * local_538;
                        facet_p0.vect[1] = ((double)iVar35 + 0.5) * dStack_530;
                        facet_p0.vect[2] = ((double)iVar37 + 0.5) * local_558;
                        facet_p0.vect[lVar29] =
                             (double)(int)((uint)(iVar52 < *(int *)((long)&local_510 + lVar29 * 4))
                                          + iVar52) *
                             *(double *)(local_228.period.vect + lVar29 * 2);
                        dVar75 = facet_p0.vect[2] * RVar13 +
                                 facet_p0.vect[0] * RVar11 + facet_p0.vect[1] * RVar12;
                        dVar45 = dVar66 * RVar13 +
                                 (double)CONCAT44(uVar10,uStack_4e0) * RVar11 +
                                 (double)pdStack_560 * RVar12;
                        dVar46 = 1.0 - dVar45 * dVar45;
                        dVar55 = (dVar53 - dVar75 * dVar45) / dVar46;
                        dVar46 = (dVar45 * -dVar53 + dVar75) / dVar46;
                        edge_p0.vect[2] = dVar55 * dVar66 + RVar13 * dVar46;
                        edge_p0.vect[0] = dVar55 * local_568 + dVar46 * RVar11;
                        edge_p0.vect[1] = dVar55 * (double)pdStack_560 + dVar46 * RVar12;
                        edge_v.vect[2] = RVar12 * local_568 + RVar11 * local_4d8;
                        edge_v.vect[0] = RVar13 * (double)pdStack_560 + RVar12 * -dVar66;
                        edge_v.vect[1] = dVar66 * RVar11 + RVar13 * dVar72;
                        auVar74._8_8_ = edge_v.vect[1];
                        auVar74._0_8_ = edge_v.vect[1];
                        dVar75 = -((edge_p0.vect[2] - auVar59._0_8_) * edge_v.vect[2] +
                                  (edge_p0.vect[0] - local_548) * edge_v.vect[0] +
                                  (edge_p0.vect[1] - dVar61) * edge_v.vect[1]) /
                                 (edge_v.vect[2] * edge_v.vect[2] +
                                 edge_v.vect[0] * edge_v.vect[0] + edge_v.vect[1] * edge_v.vect[1]);
                        c_vec_tmp.vect[0] = dVar75 * edge_v.vect[0] + edge_p0.vect[0];
                        c_vec_tmp.vect[1] = dVar75 * edge_v.vect[1] + edge_p0.vect[1];
                        c_vec_tmp.vect[2] = dVar75 * edge_v.vect[2] + edge_p0.vect[2];
                        auVar80 = _DAT_006fccf0;
                        if ((2.220446049250313e-16 < ABS(edge_v.vect[0])) &&
                           (auVar69._8_8_ = edge_v.vect[0], auVar69._0_8_ = edge_v.vect[0],
                           auVar79._8_8_ = -(edge_p0.vect[0] + dStack_570),
                           auVar79._0_8_ = -(edge_p0.vect[0] + local_578),
                           auVar80 = divpd(auVar79,auVar69), 0.0 <= edge_v.vect[0])) {
                          uVar73 = auVar80._8_8_;
                          auVar80._8_8_ = auVar80._0_8_;
                          auVar80._0_8_ = uVar73;
                        }
                        auVar82 = _DAT_006fccf0;
                        if ((2.220446049250313e-16 < ABS(edge_v.vect[1])) &&
                           (auVar81._8_8_ = -(edge_p0.vect[1] + -(double)iVar35 * dVar5),
                           auVar81._0_8_ = -(edge_p0.vect[1] + -(double)(iVar35 + 1) * dVar5),
                           auVar82 = divpd(auVar81,auVar74), 0.0 <= edge_v.vect[1])) {
                          uVar73 = auVar82._8_8_;
                          auVar82._8_8_ = auVar82._0_8_;
                          auVar82._0_8_ = uVar73;
                        }
                        auVar71 = _DAT_006fccf0;
                        if ((2.220446049250313e-16 < ABS(edge_v.vect[2])) &&
                           (auVar70._8_8_ = -(edge_p0.vect[2] + (double)pdStack_580),
                           auVar70._0_8_ = -(edge_p0.vect[2] + (double)local_588),
                           auVar3._8_8_ = edge_v.vect[2], auVar3._0_8_ = edge_v.vect[2],
                           auVar71 = divpd(auVar70,auVar3), 0.0 <= edge_v.vect[2])) {
                          uVar73 = auVar71._8_8_;
                          auVar71._8_8_ = auVar71._0_8_;
                          auVar71._0_8_ = uVar73;
                        }
                        dVar45 = auVar82._0_8_;
                        if (auVar82._0_8_ <= auVar80._0_8_) {
                          dVar45 = auVar80._0_8_;
                        }
                        dVar46 = auVar71._0_8_;
                        if (auVar71._0_8_ <= dVar45) {
                          dVar46 = dVar45;
                        }
                        if (dVar46 <= dVar75) {
                          dVar45 = auVar82._8_8_;
                          if (auVar80._8_8_ <= auVar82._8_8_) {
                            dVar45 = auVar80._8_8_;
                          }
                          dVar55 = auVar71._8_8_;
                          if (dVar45 <= auVar71._8_8_) {
                            dVar55 = dVar45;
                          }
                          dVar46 = dVar75;
                          if (dVar55 < dVar75) {
                            dVar46 = dVar55;
                          }
                        }
                        local_448[0] = 0.0;
                        local_448[1] = 0.0;
                        local_448[2] = 0.0;
                        for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
                          dVar75 = edge_v.vect[lVar29] * dVar46 + edge_p0.vect[lVar29];
                          c_vec_tmp.vect[lVar29] = dVar75;
                          local_448[lVar29] = dVar75 - (double)(&local_350)[lVar29];
                        }
                        auVar68._0_8_ =
                             local_448[2] * local_448[2] +
                             local_448[0] * local_448[0] + local_448[1] * local_448[1];
                        auVar68._8_8_ = 0;
                        if (auVar68._0_8_ < dVar67) {
                          local_698 = c_vec_tmp.vect[0];
                          local_728 = c_vec_tmp.vect[1];
                          local_748 = c_vec_tmp.vect[2];
                          dVar67 = auVar68._0_8_;
                        }
                      }
                      else {
                        auVar68._8_8_ =
                             -(ulong)(ABS(facet_normal.vect[1]) == ABS((double)pdStack_560));
                        auVar68._0_8_ = (double)-(ulong)(ABS(facet_normal.vect[2]) == ABS(dVar66));
                        iVar52 = movmskpd(0,auVar68);
                        if (iVar52 != 3) goto LAB_0059e77e;
                      }
                    }
                    dVar67 = (local_748 - auVar59._0_8_) * (local_748 - auVar59._0_8_) +
                             (local_698 - local_548) * (local_698 - local_548) +
                             (local_728 - dVar61) * (local_728 - dVar61);
                    if (dVar54 <= dVar67) {
                      dVar67 = dVar54;
                    }
                    if (dVar67 < 0.0) {
                      dVar67 = sqrt(dVar67);
                      in_XMM5_Qb = extraout_XMM0_Qb;
                    }
                    else {
                      dVar67 = SQRT(dVar67);
                    }
                    dVar67 = ABS(dVar67);
                    in_XMM5_Qb = in_XMM5_Qb & 0x7fffffffffffffff;
                  }
LAB_0059e481:
                  uVar27 = -(ulong)(0.0 < pdVar14[lVar36 + lVar24 + (iVar60 - lVar38)]);
                  if (dVar43 <= dVar67) {
                    dVar67 = dVar43;
                  }
                  pdVar14[lVar36 + lVar24 + (iVar60 - lVar38)] =
                       dVar67 * (double)(~uVar27 & uVar44 | uVar27 & local_598._0_8_);
                  bVar19 = iVar60 != iVar9;
                  auVar58._8_8_ = 0;
                  auVar58._0_8_ = auVar59._0_8_;
                  iVar60 = iVar60 + 1;
                } while (bVar19);
              }
            }
          }
          Gpu::Device::streamSynchronize();
          PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>::
          ~PODVector(&facets);
        }
      }
      PODVector<int,_std::allocator<int>_>::~PODVector(&cutcell_offset);
      PODVector<int,_std::allocator<int>_>::~PODVector(&is_cut);
    }
    else {
      lVar41 = (long)local_5b4.smallend.vect[2];
      uVar20 = local_5b4.bigend.vect[0] - local_5b4.smallend.vect[0];
      auVar50._4_4_ = 0;
      auVar50._0_4_ = uVar20;
      auVar50._8_4_ = uVar20;
      auVar50._12_4_ = 0;
      lVar26 = (long)local_3a8.p +
               ((long)local_5b4.smallend.vect[1] - (long)local_3a8.begin.y) * local_3a8.jstride * 8
               + (lVar41 - local_3a8.begin.z) * local_3a8.kstride * 8 +
               (long)local_5b4.smallend.vect[0] * 8 + (long)local_3a8.begin.x * -8 + 8;
      for (; lVar31 = lVar26, lVar22 = (long)local_5b4.smallend.vect[1], in_XMM5_Qb = uStack_6d0,
          lVar41 <= local_5b4.bigend.vect[2]; lVar41 = lVar41 + 1) {
        for (; lVar22 <= local_5b4.bigend.vect[1]; lVar22 = lVar22 + 1) {
          if (local_5b4.smallend.vect[0] <= local_5b4.bigend.vect[0]) {
            uVar27 = 0;
            do {
              auVar56._8_4_ = (int)uVar27;
              auVar56._0_8_ = uVar27;
              auVar56._12_4_ = (int)(uVar27 >> 0x20);
              auVar58 = auVar50 ^ auVar77;
              auVar56 = (auVar56 | auVar8) ^ auVar77;
              bVar19 = auVar58._0_4_ < auVar56._0_4_;
              iVar60 = auVar58._4_4_;
              iVar64 = auVar56._4_4_;
              if ((bool)(~(iVar60 < iVar64 || iVar64 == iVar60 && bVar19) & 1)) {
                uVar25 = -(ulong)(0.0 < *(double *)(lVar31 + -8 + uVar27 * 8));
                *(double *)(lVar31 + -8 + uVar27 * 8) =
                     (double)(~uVar25 & uVar44 | uVar25 & local_598._0_8_) * dVar43;
              }
              if (iVar60 >= iVar64 && (iVar64 != iVar60 || !bVar19)) {
                uVar25 = -(ulong)(0.0 < *(double *)(lVar31 + uVar27 * 8));
                *(double *)(lVar31 + uVar27 * 8) =
                     (double)(~uVar25 & uVar44 | uVar25 & local_598._0_8_) * dVar43;
              }
              uVar27 = uVar27 + 2;
            } while (((ulong)uVar20 + 2 & 0xfffffffffffffffe) != uVar27);
          }
          lVar31 = lVar31 + local_3a8.jstride * 8;
        }
        lVar26 = lVar26 + local_3a8.kstride * 8;
      }
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void FillSignedDistance (MultiFab& mf, EB2::Level const& ls_lev,
                         EBFArrayBoxFactory const& eb_factory, int refratio,
                         bool fluid_has_positive_sign)
{
    AMREX_ALWAYS_ASSERT(mf.is_nodal());

    ls_lev.fillLevelSet(mf, ls_lev.Geom()); // This is the implicit function, not the SDF.

    const auto& bndrycent = eb_factory.getBndryCent();
    const auto& areafrac = eb_factory.getAreaFrac();
    const auto& flags = eb_factory.getMultiEBCellFlagFab();
    const int eb_pad = bndrycent.nGrow();

    const auto dx_ls = ls_lev.Geom().CellSizeArray();
    const auto dx_eb = eb_factory.Geom().CellSizeArray();
    Real dx_eb_max = amrex::max(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2]));
    Real ls_roof = amrex::min(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2])) * (flags.nGrow()+1);

    Real fluid_sign = fluid_has_positive_sign ? 1._rt : -1._rt;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        Box const& gbx = mfi.fabbox();
        Array4<Real> const& fab = mf.array(mfi);

        if (bndrycent.ok(mfi))
        {
            const auto& flag = flags.const_array(mfi);

            Box eb_search = mfi.validbox();
            eb_search.coarsen(refratio).enclosedCells().grow(eb_pad);

            const int nallcells = eb_search.numPts();

            Gpu::DeviceVector<int> is_cut(nallcells);
            int* p_is_cut = is_cut.data();

            Gpu::DeviceVector<int> cutcell_offset(nallcells);
            int* p_cutcell_offset = cutcell_offset.data();

            int ncutcells = Scan::PrefixSum<int>
                (nallcells,
                 [=] AMREX_GPU_DEVICE (int icell) -> int
                 {
                     GpuArray<int,3> ijk = eb_search.atOffset3d(icell);
                     int is_cut_cell = flag(ijk[0],ijk[1],ijk[2]).isSingleValued();
                     p_is_cut[icell] = is_cut_cell;
                     return is_cut_cell;
                 },
                 [=] AMREX_GPU_DEVICE (int icell, int const& x)
                 {
                     p_cutcell_offset[icell] = x;
                 },
                 Scan::Type::exclusive, Scan::retSum);

            if (ncutcells > 0) {
                Gpu::DeviceVector<GpuArray<Real,AMREX_SPACEDIM*2> > facets(ncutcells);
                auto p_facets = facets.data();
                Array4<Real const> const& bcent = bndrycent.const_array(mfi);
                AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                             Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                             Array4<Real const> const& apz = areafrac[2]->const_array(mfi));
                amrex::ParallelFor(eb_search, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    int icell = eb_search.index(IntVect(AMREX_D_DECL(i,j,k)));
                    if (p_is_cut[icell]) {
                        GpuArray<Real,AMREX_SPACEDIM*2>& fac = p_facets[p_cutcell_offset[icell]];
                        AMREX_D_TERM(fac[0] = (bcent(i,j,k,0)+Real(i)+0.5_rt) * dx_eb[0];,
                                     fac[1] = (bcent(i,j,k,1)+Real(j)+0.5_rt) * dx_eb[1];,
                                     fac[2] = (bcent(i,j,k,2)+Real(k)+0.5_rt) * dx_eb[2]);

                         Real axm = apx(i,  j  , k  );
                         Real axp = apx(i+1,j  , k  );
                         Real aym = apy(i,  j  , k  );
                         Real ayp = apy(i,  j+1, k  );
#if (AMREX_SPACEDIM == 3)
                         Real azm = apz(i,  j  , k  );
                         Real azp = apz(i,  j  , k+1);
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp) +
                                                 (azm-azp)*(azm-azp));
#else
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp));
#endif
                         Real apnorminv = 1._rt / apnorm;
                         AMREX_D_TERM(Real anrmx = (axp-axm) * apnorminv;,   // pointing to the wall
                                      Real anrmy = (ayp-aym) * apnorminv;,
                                      Real anrmz = (azp-azm) * apnorminv);

                         // pointing to the fluid
                         AMREX_D_TERM(fac[AMREX_SPACEDIM+0] = -anrmx;,
                                      fac[AMREX_SPACEDIM+1] = -anrmy;,
                                      fac[AMREX_SPACEDIM+2] = -anrmz);
                    }
                });

                amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    AMREX_D_TERM(Real dxinv = 1._rt/dx_eb[0];,
                                 Real dyinv = 1._rt/dx_eb[1];,
                                 Real dzinv = 1._rt/dx_eb[2]);
                    AMREX_D_TERM(Real x = i*dx_ls[0];,
                                 Real y = j*dx_ls[1];,
                                 Real z = k*dx_ls[2]);
                    Real min_dist2 = std::numeric_limits<Real>::max();
                    int i_nearest = 0;
                    for (int ifac  = 0; ifac < ncutcells; ++ifac) {
                        AMREX_D_TERM(Real cx = p_facets[ifac][0];,
                                     Real cy = p_facets[ifac][1];,
                                     Real cz = p_facets[ifac][2]);
                        Real dist2 = AMREX_D_TERM((x-cx)*(x-cx),+(y-cy)*(y-cy),+(z-cz)*(z-cz));
                        if (dist2 < min_dist2) {
                            i_nearest = ifac;
                            min_dist2 = dist2;
                        }
                    }

                    // Test if pos "projects onto" the nearest EB facet's interior
                    AMREX_D_TERM(Real cx = p_facets[i_nearest][0];,
                                 Real cy = p_facets[i_nearest][1];,
                                 Real cz = p_facets[i_nearest][2]);
                    AMREX_D_TERM(Real nx = p_facets[i_nearest][AMREX_SPACEDIM+0];,
                                 Real ny = p_facets[i_nearest][AMREX_SPACEDIM+1];,
                                 Real nz = p_facets[i_nearest][AMREX_SPACEDIM+2]);
                    Real dist_proj = AMREX_D_TERM((x-cx)*(-nx),+(y-cy)*(-ny),+(z-cz)*(-nz));
                    AMREX_D_TERM(Real eb_min_x = x + nx*dist_proj;,
                                 Real eb_min_y = y + ny*dist_proj;,
                                 Real eb_min_z = z + nz*dist_proj);
                    AMREX_D_TERM(int vi_cx = static_cast<int>(amrex::Math::floor(cx * dxinv));,
                                 int vi_cy = static_cast<int>(amrex::Math::floor(cy * dyinv));,
                                 int vi_cz = static_cast<int>(amrex::Math::floor(cz * dzinv)));
                    AMREX_D_TERM(int vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                 int vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                 int vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));

                    bool min_pt_valid = false;
                    if ((AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z))  ||
                        amrex::Math::abs(dist_proj) > ls_roof + dx_eb_max)
                    {
                        // If the distance is very big, we can set it to true as well.
                        // Later the signed distance will be assigned the roof value.
                        min_pt_valid = true;
                    } else { // rounding error might give false negatives
#if (AMREX_SPACEDIM == 3)
                        for (int k_shift = -1; k_shift <= 1; ++k_shift) {
#endif
                        for (int j_shift = -1; j_shift <= 1; ++j_shift) {
                        for (int i_shift = -1; i_shift <= 1; ++i_shift) {
                            AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor((eb_min_x+i_shift*1.e-6_rt*dx_eb[0])*dxinv));,
                                         vi_y = static_cast<int>(amrex::Math::floor((eb_min_y+j_shift*1.e-6_rt*dx_eb[1])*dyinv));,
                                         vi_z = static_cast<int>(amrex::Math::floor((eb_min_z+k_shift*1.e-6_rt*dx_eb[2])*dzinv)));
                            if (AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z)) {
                                min_pt_valid = true;
                                goto after_loops;
                            }
                        }}
#if (AMREX_SPACEDIM == 3)
                        }
#endif
                        after_loops:;
                    }

                    // If projects onto nearest EB facet, then return projected distance
                    // Alternatively: find the nearest point on the EB edge
                    Real min_dist;
                    if ( min_pt_valid ) {
                        // this is a signed distance function
                        min_dist = dist_proj;
                    } else {
                        // fallback: find the nearest point on the EB edge
                        // revert the value of vi_x, vi_y and vi_z
                        AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                     vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                     vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));
                        auto c_vec = detail::facets_nearest_pt
                            ({AMREX_D_DECL(vi_x,vi_y,vi_z)}, {AMREX_D_DECL(vi_cx, vi_cy, vi_cz)},
                             {AMREX_D_DECL(x,y,z)}, {AMREX_D_DECL(nx,ny,nz)},
                             {AMREX_D_DECL(cx,cy,cz)}, dx_eb);
                        Real min_edge_dist2 = AMREX_D_TERM( (c_vec[0]-x)*(c_vec[0]-x),
                                                           +(c_vec[1]-y)*(c_vec[1]-y),
                                                           +(c_vec[2]-z)*(c_vec[2]-z));
                        min_dist = -std::sqrt(amrex::min(min_dist2, min_edge_dist2));
                    }

                    Real usd = amrex::min(ls_roof,amrex::Math::abs(min_dist));
                    if (fab(i,j,k) <= 0._rt) {
                        fab(i,j,k) = fluid_sign * usd;
                    } else {
                        fab(i,j,k) = (-fluid_sign) * usd;
                    }
                });
                Gpu::streamSynchronize();
            }
        } else {
            amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                if (fab(i,j,k) <= 0._rt) {
                    fab(i,j,k) = fluid_sign * ls_roof;
                } else {
                    fab(i,j,k) = (-fluid_sign) * ls_roof;
                }
            });
        }
    }

    mf.FillBoundary(0,1,ls_lev.Geom().periodicity());
}

}